

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O0

void on_handshake_complete(h2o_socket_t *sock,char *err)

{
  h2o_cache_hashcode_t keyhash;
  h2o_cache_t *cache;
  st_h2o_socket_ssl_t *psVar1;
  h2o_socket_cb p_Var2;
  int iVar3;
  size_t sVar4;
  SSL_CIPHER *c;
  ulong uVar5;
  SSL_SESSION *base;
  h2o_loop_t *loop;
  uint64_t now;
  h2o_iovec_t value;
  h2o_socket_cb handshake_cb;
  SSL_SESSION *session;
  SSL_CIPHER *cipher;
  char *err_local;
  h2o_socket_t *sock_local;
  
  if (err == (char *)0x0) {
    if (sock->ssl->ptls == (ptls_t *)0x0) {
      c = SSL_get_current_cipher((SSL *)sock->ssl->ossl);
      uVar5 = SSL_CIPHER_get_id(c);
      iVar3 = (int)uVar5;
      if (((iVar3 + 0xfcffff64U < 4) || (iVar3 + 0xfcff3fd5U < 2)) ||
         (iVar3 == 0x300c02f || iVar3 == 0x300c030)) {
        sock->ssl->record_overhead = 0x1d;
      }
      else {
        sock->ssl->record_overhead = 0x20;
      }
    }
    else {
      sVar4 = ptls_get_record_overhead(sock->ssl->ptls);
      sock->ssl->record_overhead = sVar4;
    }
  }
  if (((sock->ssl->ossl != (SSL *)0x0) && (iVar3 = SSL_is_server(sock->ssl->ossl), iVar3 == 0)) &&
     (((sock->ssl->handshake).field_1.client.session_cache != (h2o_cache_t *)0x0 &&
      ((err == (char *)0x0 || (err == h2o_socket_error_ssl_cert_name_mismatch)))))) {
    base = SSL_get1_session((SSL *)sock->ssl->ossl);
    cache = (sock->ssl->handshake).field_1.client.session_cache;
    loop = h2o_socket_get_loop(sock);
    now = h2o_now(loop);
    psVar1 = sock->ssl;
    keyhash = (sock->ssl->handshake).field_1.client.session_cache_key_hash;
    value = h2o_iovec_init(base,1);
    h2o_cache_set(cache,now,(psVar1->handshake).field_1.client.session_cache_key,keyhash,value);
  }
  p_Var2 = (sock->ssl->handshake).cb;
  (sock->_cb).write = (h2o_socket_cb)0x0;
  (sock->ssl->handshake).cb = (h2o_socket_cb)0x0;
  if (err == (char *)0x0) {
    decode_ssl_input(sock);
  }
  (*p_Var2)(sock,err);
  return;
}

Assistant:

static void on_handshake_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err == NULL) {
        /* success */
    } else if (err == h2o_socket_error_ssl_cert_name_mismatch &&
               (SSL_CTX_get_verify_mode(client->super.ctx->ssl_ctx) & SSL_VERIFY_PEER) == 0) {
        /* peer verification skipped */
    } else {
        on_connect_error(client, err);
        return;
    }

    on_connection_ready(client);
}